

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int *activateScaling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double __x;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int expTmp;
  int local_64;
  double *local_60;
  double *local_58;
  BeagleCPUImpl<double,_1,_0> *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  
  if (0 < this->kCategoryCount) {
    iVar6 = 0;
    local_60 = partials1;
    local_58 = partials2;
    local_50 = this;
    local_48 = destP;
    local_40 = matrices1;
    local_38 = matrices2;
    do {
      if (0 < this->kPatternCount) {
        uVar7 = this->kPartialsPaddedStateCount * iVar6 * this->kPatternCount;
        iVar9 = 0;
        uVar13 = (ulong)uVar7;
        do {
          pdVar4 = local_58;
          pdVar3 = local_60;
          uVar5 = this->kStateCount;
          if (0 < (int)uVar5) {
            iVar11 = this->kMatrixSize * iVar6;
            uVar13 = (ulong)(int)uVar13;
            iVar12 = 0;
            do {
              if ((int)uVar5 < 1) {
                __x = 0.0;
              }
              else {
                auVar14 = ZEXT816(0);
                uVar10 = 0;
                auVar15 = ZEXT864(0) << 0x40;
                do {
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_40[(long)iVar11 + uVar10];
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = pdVar3[(long)(int)uVar7 + uVar10];
                  auVar1 = vfmadd231sd_fma(auVar15._0_16_,auVar16,auVar1);
                  auVar15 = ZEXT1664(auVar1);
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = local_38[(long)iVar11 + uVar10];
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = pdVar4[(long)(int)uVar7 + uVar10];
                  auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar2);
                  uVar10 = uVar10 + 1;
                } while (uVar5 != uVar10);
                iVar11 = iVar11 + uVar5;
                __x = auVar1._0_8_ * auVar14._0_8_;
              }
              destP[uVar13] = __x;
              if (*activateScaling == 0) {
                frexp(__x,&local_64);
                iVar8 = -local_64;
                if (0 < local_64) {
                  iVar8 = local_64;
                }
                destP = local_48;
                this = local_50;
                if (local_50->scalingExponentThreshold < iVar8) {
                  *activateScaling = 1;
                }
              }
              iVar11 = iVar11 + 1;
              uVar13 = uVar13 + 1;
              iVar12 = iVar12 + 1;
              uVar5 = this->kStateCount;
            } while (iVar12 < (int)uVar5);
          }
          uVar7 = uVar7 + this->kPartialsPaddedStateCount;
          iVar9 = iVar9 + 1;
        } while (iVar9 < this->kPatternCount);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->kCategoryCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}